

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::handle_inconsistent_hashes(torrent *this,piece_index_t piece)

{
  bool bVar1;
  torrent_info *this_00;
  const_reference local_70;
  bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void> local_5d [17];
  int local_4c;
  error_code local_48;
  file_index_t local_38;
  int local_34;
  file_index_t file;
  vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_> file_slices;
  torrent *this_local;
  piece_index_t piece_local;
  
  this_00 = torrent_file(this);
  local_34 = piece.m_val;
  torrent_info::map_block
            ((vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_> *)&file,
             this_00,piece,0,0);
  bVar1 = ::std::vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_>::empty
                    ((vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_> *)
                     &file);
  if (bVar1) {
    local_70 = (const_reference)&torrent_status::error_file_none;
  }
  else {
    local_70 = ::std::vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_>::
               operator[]((vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_> *
                          )&file,0);
  }
  local_38.m_val = (local_70->file_index).m_val;
  boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
            (&local_48,torrent_inconsistent_hashes,(type *)0x0);
  local_4c = local_38.m_val;
  set_error(this,&local_48,local_38);
  ::std::
  unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>::
  reset(&(this->super_torrent_hot_members).m_picker,(pointer)0x0);
  ::std::
  unique_ptr<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>::
  reset(&(this->super_torrent_hot_members).m_hash_picker,(pointer)0x0);
  aux::file_progress::clear(&this->m_file_progress);
  (this->super_torrent_hot_members).field_0x4b = (this->super_torrent_hot_members).field_0x4b & 0xbf
  ;
  update_gauge(this);
  libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void>::bitfield_flag
            (local_5d);
  pause(this);
  ::std::vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_>::~vector
            ((vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_> *)&file);
  return;
}

Assistant:

void torrent::handle_inconsistent_hashes(piece_index_t const piece)
	{
		auto const file_slices = torrent_file().map_block(piece, 0, 0);
		file_index_t const file = file_slices.empty() ? torrent_status::error_file_none : file_slices[0].file_index;
		set_error(errors::torrent_inconsistent_hashes, file);
		// if this is a hybrid torrent, we may have marked some more pieces
		// as "have" but not yet validated them against the v2 hashes. At
		// this point, just assume we have no pieces
		m_picker.reset();
		m_hash_picker.reset();
		m_file_progress.clear();
		m_have_all = false;
		update_gauge();
		pause();
	}